

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall google::protobuf::internal::SooRep::set_size(SooRep *this,bool is_soo,int size)

{
  ulong uVar1;
  
  uVar1 = (this->field_0).long_rep.elements_int;
  if (((uVar1 & 4) == 0) == is_soo) {
    if (is_soo) {
      if (3 < size) goto LAB_0018e9ad;
      (this->field_0).long_rep.elements_int = (long)size | uVar1 & 0xfffffffffffffff8;
    }
    else {
      (this->field_0).long_rep.size = size;
    }
    return;
  }
  set_size();
LAB_0018e9ad:
  set_size();
}

Assistant:

void set_size(bool is_soo, int size) {
    ABSL_DCHECK_EQ(is_soo, this->is_soo());
    if (is_soo) {
      ABSL_DCHECK_LE(size, kSooSizeMask);
      short_rep.arena_and_size &= kSooPtrMask;
      short_rep.arena_and_size |= size;
    } else {
      long_rep.size = size;
    }
  }